

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_namer.h
# Opt level: O2

string * __thiscall
flatbuffers::BfbsNamer::Field_abi_cxx11_(string *__return_storage_ptr__,BfbsNamer *this,Field *f)

{
  String *this_00;
  string sStack_38;
  
  this_00 = reflection::Field::name(f);
  String::str_abi_cxx11_(&sStack_38,this_00);
  (*(this->super_Namer)._vptr_Namer[0x12])(__return_storage_ptr__,this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Field(const ::reflection::Field &f) const {
    return Field(f.name()->str());
  }